

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GoogleTestApprovalsTests.cpp
# Opt level: O2

void __thiscall
GoogleTestApprovalsTests_SpecificReporter_Test::TestBody
          (GoogleTestApprovalsTests_SpecificReporter_Test *this)

{
  Options local_e0;
  AraxisMergeReporter local_78;
  
  ApprovalTests::Windows::AraxisMergeReporter::AraxisMergeReporter(&local_78);
  ApprovalTests::Options::Options(&local_e0,(Reporter *)&local_78);
  ApprovalTests::TApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>>::
  verify<char[20],int>((char (*) [20])"text to be verified",&local_e0);
  ApprovalTests::Options::~Options(&local_e0);
  ApprovalTests::CommandReporter::~CommandReporter((CommandReporter *)&local_78);
  return;
}

Assistant:

TEST(GoogleTestApprovalsTests, SpecificReporter)
{
    // begin-snippet: basic_approval_with_reporter
    using namespace ApprovalTests;
    Approvals::verify("text to be verified", Options(Windows::AraxisMergeReporter()));
    // end-snippet
}